

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O1

void __thiscall
chrono::ChSystemDescriptor::WriteMatrixSpmv(ChSystemDescriptor *this,string *path,string *prefix)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  long *plVar6;
  undefined8 *puVar7;
  ChConstraint **cnstr;
  pointer ppCVar8;
  _func_int **pp_Var9;
  long *plVar10;
  char *__function;
  long lVar11;
  ActualDstType actualDst;
  long lVar12;
  string *psVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ChVectorDynamic<> e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ChVectorDynamic<> v;
  ChMatrixDynamic<> A;
  string filename;
  ChVectorDynamic<double> rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  ChSparseMatrix Z;
  ChStreamOutAsciiFile file_rhs;
  ChStreamOutAsciiFile file_Z;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_728;
  long *local_718;
  long local_710;
  long local_708;
  long lStack_700;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_6f8;
  DenseStorage<double,__1,__1,__1,_1> local_6e8;
  string *local_6d0;
  char *local_6c8;
  undefined8 local_6c0;
  char local_6b8;
  undefined7 uStack_6b7;
  long local_6a8;
  long lStack_6a0;
  long *local_690 [2];
  long local_680 [2];
  _func_int **local_670;
  string *local_668;
  SparseMatrix<double,_1,_int> local_660;
  undefined1 local_610 [16];
  _func_int *local_600;
  long lStack_5f8;
  ChStreamOutAscii local_340;
  undefined1 local_320 [16];
  _func_int *local_310;
  RealScalar RStack_308;
  ChStreamOutAscii local_50;
  
  local_6c8 = &local_6b8;
  local_6c0 = 0;
  local_6b8 = '\0';
  iVar4 = 0;
  psVar13 = path;
  for (ppCVar8 = (this->vconstraints).
                 super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar8 !=
      (this->vconstraints).
      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar8 = ppCVar8 + 1) {
    psVar13 = (string *)(ulong)(*ppCVar8)->active;
    iVar4 = iVar4 + (uint)(*ppCVar8)->active;
  }
  uVar16 = (long)iVar4 + (long)this->n_q;
  local_6e8.m_data = (double *)0x0;
  local_6e8.m_rows = 0;
  local_6e8.m_cols = 0;
  iVar4 = (int)uVar16;
  local_6d0 = path;
  if (iVar4 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  if ((iVar4 != 0) &&
     (auVar2._8_8_ = 0, auVar2._0_8_ = uVar16,
     auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar3 / auVar2,0) < (long)uVar16)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,psVar13,SUB168(auVar3 % auVar2,0));
    *puVar7 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_6e8,uVar16 * uVar16,uVar16,uVar16);
  local_6f8.m_storage.m_data = (double *)0x0;
  local_6f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_6f8,uVar16);
  local_728.m_storage.m_data = (double *)0x0;
  local_728.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_728,uVar16);
  local_668 = prefix;
  if (local_728.m_storage.m_rows < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (local_728.m_storage.m_rows != 0) {
    memset(local_728.m_storage.m_data,0,local_728.m_storage.m_rows << 3);
  }
  if (iVar4 != 0) {
    uVar15 = 1;
    if (1 < iVar4) {
      uVar15 = uVar16 & 0xffffffff;
    }
    lVar11 = 0;
    uVar16 = 0;
    do {
      if (local_728.m_storage.m_rows <= (long)uVar16) {
LAB_007b2570:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_728.m_storage.m_data[uVar16] = 1.0;
      (*this->_vptr_ChSystemDescriptor[0x17])(this,&local_6f8,&local_728);
      if (local_6e8.m_rows < 0 && local_6e8.m_data != (double *)0x0) {
        __function = 
        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
        ;
        goto LAB_007b25e2;
      }
      if (local_6e8.m_cols <= (long)uVar16) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (local_6e8.m_rows != local_6f8.m_storage.m_rows) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      if (0 < local_6e8.m_rows) {
        pdVar5 = (double *)((long)local_6e8.m_data + lVar11);
        lVar14 = 0;
        do {
          *pdVar5 = local_6f8.m_storage.m_data[lVar14];
          lVar14 = lVar14 + 1;
          pdVar5 = pdVar5 + local_6e8.m_cols;
        } while (local_6e8.m_rows != lVar14);
      }
      if (local_728.m_storage.m_rows <= (long)uVar16) goto LAB_007b2570;
      local_728.m_storage.m_data[uVar16] = 0.0;
      uVar16 = uVar16 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar16 != uVar15);
  }
  local_320._0_8_ = local_320._0_8_ & 0xffffffffffffff00;
  local_320._8_8_ = &local_6e8;
  local_310 = (_func_int *)0x0;
  RStack_308 = 1e-12;
  local_660.super_SparseCompressedBase<Eigen::SparseMatrix<double,_1,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_1,_int>_>)false;
  local_660._vptr_SparseMatrix = (_func_int **)&PTR_SetElement_00b34038;
  local_660.m_outerSize = 0;
  local_660.m_innerSize = 0;
  local_660.m_outerIndex = (StorageIndex *)0x0;
  local_660.m_innerNonZeros = (StorageIndex *)0x0;
  local_660.m_data.m_values = (Scalar *)0x0;
  local_660.m_data.m_indices = (StorageIndex *)0x0;
  local_660.m_data.m_size = 0;
  local_660.m_data.m_allocatedSize = 0;
  Eigen::internal::
  assign_sparse_to_sparse<Eigen::SparseMatrix<double,1,int>,Eigen::SparseView<Eigen::Matrix<double,_1,_1,1,_1,_1>>>
            (&local_660,(SparseView<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)local_320);
  pcVar1 = (local_6d0->_M_dataplus)._M_p;
  local_718 = &local_708;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_718,pcVar1,pcVar1 + local_6d0->_M_string_length);
  psVar13 = local_668;
  std::__cxx11::string::append((char *)&local_718);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_718,(ulong)(psVar13->_M_dataplus)._M_p);
  pp_Var9 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var9) {
    local_600 = *pp_Var9;
    lStack_5f8 = plVar6[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var9;
    local_610._0_8_ = (_func_int **)*plVar6;
  }
  local_610._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_610);
  local_670 = (_func_int **)&PTR_SetElement_00b34038;
  pp_Var9 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var9) {
    local_310 = *pp_Var9;
    RStack_308 = (RealScalar)plVar6[3];
    local_320._0_8_ = &local_310;
  }
  else {
    local_310 = *pp_Var9;
    local_320._0_8_ = (_func_int **)*plVar6;
  }
  local_320._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6c8,(string *)local_320);
  if ((_func_int **)local_320._0_8_ != &local_310) {
    operator_delete((void *)local_320._0_8_,(ulong)(local_310 + 1));
  }
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,local_708 + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320,local_6c8,_S_trunc);
  builtin_strncpy(local_50.number_format,"%.12g",6);
  StreamOUTsparseMatlabFormat(&local_660,&local_50);
  local_6a8 = 0;
  lStack_6a0 = 0;
  (*this->_vptr_ChSystemDescriptor[0x1c])(this,0);
  pcVar1 = (local_6d0->_M_dataplus)._M_p;
  local_690[0] = local_680;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_690,pcVar1,pcVar1 + local_6d0->_M_string_length);
  std::__cxx11::string::append((char *)local_690);
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_690,(ulong)(psVar13->_M_dataplus)._M_p);
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_708 = *plVar10;
    lStack_700 = plVar6[3];
    local_718 = &local_708;
  }
  else {
    local_708 = *plVar10;
    local_718 = (long *)*plVar6;
  }
  local_710 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_718);
  pp_Var9 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var9) {
    local_600 = *pp_Var9;
    lStack_5f8 = plVar6[3];
    local_610._0_8_ = &local_600;
  }
  else {
    local_600 = *pp_Var9;
    local_610._0_8_ = (_func_int **)*plVar6;
  }
  local_610._8_8_ = plVar6[1];
  *plVar6 = (long)pp_Var9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_6c8,(string *)local_610);
  if ((_func_int **)local_610._0_8_ != &local_600) {
    operator_delete((void *)local_610._0_8_,(ulong)(local_600 + 1));
  }
  if (local_718 != &local_708) {
    operator_delete(local_718,local_708 + 1);
  }
  if (local_690[0] != local_680) {
    operator_delete(local_690[0],local_680[0] + 1);
  }
  ChStreamOutAsciiFile::ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610,local_6c8,_S_trunc);
  lVar14 = lStack_6a0;
  lVar11 = local_6a8;
  builtin_strncpy(local_340.number_format,"%.12g",6);
  if (-1 < lStack_6a0 || local_6a8 == 0) {
    if (0 < lStack_6a0) {
      lVar12 = 0;
      do {
        if (lVar14 <= lVar12) {
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                       );
        }
        ChStreamOutAscii::operator<<(&local_340,*(double *)(lVar11 + lVar12 * 8));
        ChStreamOutAscii::operator<<(&local_340,"\n");
        lVar12 = lVar12 + 1;
      } while (lVar14 != lVar12);
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_610);
    if (local_6a8 != 0) {
      free(*(void **)(local_6a8 + -8));
    }
    ChStreamOutAsciiFile::~ChStreamOutAsciiFile((ChStreamOutAsciiFile *)local_320);
    local_660._vptr_SparseMatrix = local_670;
    free(local_660.m_outerIndex);
    free(local_660.m_innerNonZeros);
    Eigen::internal::CompressedStorage<double,_int>::~CompressedStorage(&local_660.m_data);
    if (local_728.m_storage.m_data != (double *)0x0) {
      free((void *)local_728.m_storage.m_data[-1]);
    }
    if (local_6f8.m_storage.m_data != (double *)0x0) {
      free((void *)local_6f8.m_storage.m_data[-1]);
    }
    if (local_6e8.m_data != (double *)0x0) {
      free((void *)local_6e8.m_data[-1]);
    }
    if (local_6c8 != &local_6b8) {
      operator_delete(local_6c8,CONCAT71(uStack_6b7,local_6b8) + 1);
    }
    return;
  }
  __function = 
  "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
  ;
LAB_007b25e2:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

void ChSystemDescriptor::WriteMatrixSpmv(const std::string& path, const std::string& prefix) {
    const char* numformat = "%.12g";
    std::string filename;

    // Count constraints.
    int mn_c = 0;
    for (auto& cnstr : vconstraints) {
        if (cnstr->IsActive())
            mn_c++;
    }

    // Generate dense system matrix, column by column
    int size = n_q + mn_c;
    ChMatrixDynamic<> A(size, size);
    ChVectorDynamic<> v(size);
    ChVectorDynamic<> e(size);
    e.setZero();

    for (int i = 0; i < size; i++) {
        e[i] = 1;
        SystemProduct(v, e);
        A.col(i) = v;
        e[i] = 0;
    }

    // Convert to Eigen sparse matrix
    ChSparseMatrix Z = A.sparseView();

    // Write sparse matrix to file
    filename = path + "/" + prefix + "_Z.dat";
    ChStreamOutAsciiFile file_Z(filename.c_str());
    file_Z.SetNumFormat(numformat);
    StreamOUTsparseMatlabFormat(Z, file_Z);

    // Write RHS to file
    ChVectorDynamic<double> rhs;
    ConvertToMatrixForm(nullptr, &rhs);
    filename = path + "/" + prefix + "_rhs.dat";
    ChStreamOutAsciiFile file_rhs(filename.c_str());
    file_rhs.SetNumFormat(numformat);
    StreamOUTdenseMatlabFormat(rhs, file_rhs);
}